

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int createModule(sqlite3 *db,char *zName,sqlite3_module *pModule,void *pAux,
                _func_void_void_ptr *xDestroy)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  undefined8 *data;
  uint uVar5;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (zName == (char *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0xffffffff;
    pcVar3 = zName;
    do {
      uVar5 = uVar5 + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
    uVar5 = uVar5 & 0x3fffffff;
  }
  pvVar4 = sqlite3HashFind(&db->aModule,zName,uVar5);
  if (pvVar4 == (void *)0x0) {
    data = (undefined8 *)sqlite3DbMallocRaw(db,uVar5 + 0x21);
    if (data != (undefined8 *)0x0) {
      pcVar3 = (char *)(data + 4);
      memcpy(pcVar3,zName,(ulong)(uVar5 + 1));
      data[1] = pcVar3;
      *data = pModule;
      data[2] = pAux;
      data[3] = xDestroy;
      pvVar4 = sqlite3HashInsert(&db->aModule,pcVar3,uVar5,data);
      if (pvVar4 != (void *)0x0) {
        db->mallocFailed = '\x01';
        sqlite3DbFree(db,pvVar4);
      }
    }
    iVar2 = 0;
  }
  else {
    iVar2 = 0x15;
    sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x19396,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
  }
  iVar2 = sqlite3ApiExit(db,iVar2);
  if (xDestroy != (_func_void_void_ptr *)0x0 && iVar2 != 0) {
    (*xDestroy)(pAux);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar2;
}

Assistant:

static int createModule(
  sqlite3 *db,                    /* Database in which module is registered */
  const char *zName,              /* Name assigned to this module */
  const sqlite3_module *pModule,  /* The definition of the module */
  void *pAux,                     /* Context pointer for xCreate/xConnect */
  void (*xDestroy)(void *)        /* Module destructor function */
){
  int rc = SQLITE_OK;
  int nName;

  sqlite3_mutex_enter(db->mutex);
  nName = sqlite3Strlen30(zName);
  if( sqlite3HashFind(&db->aModule, zName, nName) ){
    rc = SQLITE_MISUSE_BKPT;
  }else{
    Module *pMod;
    pMod = (Module *)sqlite3DbMallocRaw(db, sizeof(Module) + nName + 1);
    if( pMod ){
      Module *pDel;
      char *zCopy = (char *)(&pMod[1]);
      memcpy(zCopy, zName, nName+1);
      pMod->zName = zCopy;
      pMod->pModule = pModule;
      pMod->pAux = pAux;
      pMod->xDestroy = xDestroy;
      pDel = (Module *)sqlite3HashInsert(&db->aModule,zCopy,nName,(void*)pMod);
      assert( pDel==0 || pDel==pMod );
      if( pDel ){
        db->mallocFailed = 1;
        sqlite3DbFree(db, pDel);
      }
    }
  }
  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && xDestroy ) xDestroy(pAux);

  sqlite3_mutex_leave(db->mutex);
  return rc;
}